

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O1

ngx_str_node_t * ngx_str_rbtree_lookup(ngx_rbtree_t *rbtree,ngx_str_t *val,uint32_t hash)

{
  ngx_str_node_t *pnVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ngx_str_node_t *pnVar6;
  bool bVar7;
  
  pnVar6 = (ngx_str_node_t *)rbtree->root;
  pnVar1 = (ngx_str_node_t *)rbtree->sentinel;
  if (pnVar6 != pnVar1) {
    do {
      uVar2 = (pnVar6->node).key;
      if (uVar2 == hash) {
        uVar2 = val->len;
        uVar3 = (pnVar6->str).len;
        bVar7 = uVar3 <= uVar2;
        if (uVar2 != uVar3) goto LAB_001183b7;
        iVar4 = memcmp(val->data,(pnVar6->str).data,uVar2);
        lVar5 = 8;
        if ((-1 < iVar4) && (lVar5 = 0x10, iVar4 == 0)) {
          return pnVar6;
        }
      }
      else {
        bVar7 = uVar2 <= hash;
LAB_001183b7:
        lVar5 = (ulong)bVar7 * 8 + 8;
      }
      pnVar6 = *(ngx_str_node_t **)((long)&(pnVar6->node).key + lVar5);
    } while (pnVar6 != pnVar1);
  }
  return (ngx_str_node_t *)0x0;
}

Assistant:

ngx_str_node_t *
ngx_str_rbtree_lookup(ngx_rbtree_t *rbtree, ngx_str_t *val, uint32_t hash)
{
    ngx_int_t           rc;
    ngx_str_node_t     *n;
    ngx_rbtree_node_t  *node, *sentinel;

    node = rbtree->root;
    sentinel = rbtree->sentinel;

    while (node != sentinel) {

        n = (ngx_str_node_t *) node;

        if (hash != node->key) {
            node = (hash < node->key) ? node->left : node->right;
            continue;
        }

        if (val->len != n->str.len) {
            node = (val->len < n->str.len) ? node->left : node->right;
            continue;
        }

        rc = ngx_memcmp(val->data, n->str.data, val->len);

        if (rc < 0) {
            node = node->left;
            continue;
        }

        if (rc > 0) {
            node = node->right;
            continue;
        }

        return n;
    }

    return NULL;
}